

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitems.h
# Opt level: O0

int __thiscall
pbrt::GetBSSRDFAndProbeRayQueue::Push
          (GetBSSRDFAndProbeRayQueue *this,Material *material,SampledWavelengths lambda,
          SampledSpectrum beta,SampledSpectrum r_u,Point3f p,Vector3f wo,Normal3f n,Normal3f ns,
          Vector3f dpdus,Point2f uv,int depth,MediumInterface *mediumInterface,Float etaScale,
          int pixelIndex)

{
  int in_EDX;
  MediumInterface *in_RSI;
  WorkQueue<pbrt::GetBSSRDFAndProbeRayWorkItem> *in_RDI;
  int in_R8D;
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  undefined1 in_XMM4 [16];
  undefined1 in_XMM6 [16];
  GetSetIndirector GVar1;
  GetSetIndirector GVar2;
  GetSetIndirector GVar3;
  GetSetIndirector GVar4;
  GetSetIndirector GVar5;
  GetSetIndirector GVar6;
  Float in_stack_00000060;
  int index;
  GetSetIndirector *this_00;
  SampledSpectrum *s;
  GetSetIndirector *this_01;
  SampledWavelengths *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  GetSetIndirector local_118;
  GetSetIndirector local_108;
  GetSetIndirector local_f8;
  GetSetIndirector local_e8;
  GetSetIndirector local_d8;
  GetSetIndirector local_c8;
  SOA<pbrt::SampledSpectrum> *local_b8;
  int local_b0;
  SOA<pbrt::SampledSpectrum> *local_a8;
  int local_a0;
  SOA<pbrt::SampledWavelengths> *local_98;
  int local_90;
  int local_88;
  int local_84;
  int local_74;
  Tuple3<pbrt::Vector3,_float> local_5c;
  Tuple3<pbrt::Vector3,_float> local_4c;
  Tuple3<pbrt::Point3,_float> local_40;
  Tuple3<pbrt::Point3,_float> local_30;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  this_01 = (GetSetIndirector *)&stack0x00000058;
  s = (SampledSpectrum *)&stack0x00000048;
  this_00 = (GetSetIndirector *)&stack0x00000008;
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_8 = vmovlpd_avx(in_XMM1);
  local_20 = vmovlpd_avx(in_XMM2);
  local_18 = vmovlpd_avx(in_XMM3);
  local_40._0_8_ = vmovlpd_avx(in_XMM4);
  local_5c._0_8_ = vmovlpd_avx(in_XMM6);
  local_84 = in_R8D;
  local_74 = in_EDX;
  local_4c._0_8_ = local_5c._0_8_;
  local_30._0_8_ = local_40._0_8_;
  local_88 = WorkQueue<pbrt::GetBSSRDFAndProbeRayWorkItem>::AllocateEntry(in_RDI);
  Material::operator=((Material *)this_00,(Material *)in_RSI);
  GVar1 = SOA<pbrt::SampledWavelengths>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).lambda,local_88);
  local_98 = GVar1.soa;
  local_90 = GVar1.index;
  SOA<pbrt::SampledWavelengths>::GetSetIndirector::operator=
            ((GetSetIndirector *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8);
  GVar2 = SOA<pbrt::SampledSpectrum>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).beta,local_88);
  local_a8 = GVar2.soa;
  local_a0 = GVar2.index;
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=(this_01,s);
  GVar2 = SOA<pbrt::SampledSpectrum>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).r_u,local_88);
  local_b8 = GVar2.soa;
  local_b0 = GVar2.index;
  SOA<pbrt::SampledSpectrum>::GetSetIndirector::operator=(this_01,s);
  GVar3 = SOA<pbrt::Point3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).p,local_88);
  local_c8.soa = GVar3.soa;
  local_c8.i = GVar3.i;
  SOA<pbrt::Point3<float>_>::GetSetIndirector::operator=(&local_c8,(Point3f *)&local_30);
  GVar4 = SOA<pbrt::Vector3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).wo,local_88);
  local_d8.soa = GVar4.soa;
  local_d8.i = GVar4.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_d8,(Vector3f *)&local_4c);
  GVar5 = SOA<pbrt::Normal3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).n,local_88);
  local_e8.soa = GVar5.soa;
  local_e8.i = GVar5.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_e8,(Normal3f *)&stack0x00000028);
  GVar5 = SOA<pbrt::Normal3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).ns,local_88);
  local_f8.soa = GVar5.soa;
  local_f8.i = GVar5.i;
  SOA<pbrt::Normal3<float>_>::GetSetIndirector::operator=(&local_f8,(Normal3f *)&stack0x00000038);
  GVar4 = SOA<pbrt::Vector3<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).dpdus,local_88);
  local_108.soa = GVar4.soa;
  local_108.i = GVar4.i;
  SOA<pbrt::Vector3<float>_>::GetSetIndirector::operator=(&local_108,(Vector3f *)s);
  GVar6 = SOA<pbrt::Point2<float>_>::operator[]
                    (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).uv,local_88);
  local_118.soa = GVar6.soa;
  local_118.i = GVar6.i;
  SOA<pbrt::Point2<float>_>::GetSetIndirector::operator=(&local_118,(Point2f *)this_01);
  (in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).depth[local_88] = local_74;
  SOA<pbrt::MediumInterface>::operator[]
            (&(in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).mediumInterface,local_88);
  SOA<pbrt::MediumInterface>::GetSetIndirector::operator=(this_00,in_RSI);
  (in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).etaScale[local_88] = in_stack_00000060;
  (in_RDI->super_SOA<pbrt::GetBSSRDFAndProbeRayWorkItem>).pixelIndex[local_88] = local_84;
  return local_88;
}

Assistant:

PBRT_CPU_GPU
    int Push(Material material, SampledWavelengths lambda, SampledSpectrum beta,
             SampledSpectrum r_u, Point3f p, Vector3f wo, Normal3f n, Normal3f ns,
             Vector3f dpdus, Point2f uv, int depth, MediumInterface mediumInterface,
             Float etaScale, int pixelIndex) {
        int index = AllocateEntry();
        this->material[index] = material;
        this->lambda[index] = lambda;
        this->beta[index] = beta;
        this->r_u[index] = r_u;
        this->p[index] = p;
        this->wo[index] = wo;
        this->n[index] = n;
        this->ns[index] = ns;
        this->dpdus[index] = dpdus;
        this->uv[index] = uv;
        this->depth[index] = depth;
        this->mediumInterface[index] = mediumInterface;
        this->etaScale[index] = etaScale;
        this->pixelIndex[index] = pixelIndex;
        return index;
    }